

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strencodings.cpp
# Opt level: O2

string * EncodeBase64_abi_cxx11_(string *__return_storage_ptr__,Span<const_unsigned_char> input)

{
  ulong uVar1;
  size_t bits;
  ulong uVar2;
  byte *pbVar3;
  byte *pbVar4;
  long in_FS_OFFSET;
  anon_class_8_1_ba1d7991 local_40;
  long local_38;
  
  pbVar4 = input.m_data;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::reserve
            (__return_storage_ptr__,((input.m_size + 2) / 3) * 4);
  pbVar3 = pbVar4 + input.m_size;
  uVar2 = 0;
  uVar1 = 0;
  local_40.str = __return_storage_ptr__;
  for (; pbVar4 != pbVar3; pbVar4 = pbVar4 + 1) {
    uVar1 = (ulong)(((uint)uVar1 & 0x1f) << 8) | (ulong)*pbVar4;
    uVar2 = uVar2 + 8;
    while (5 < uVar2) {
      uVar2 = uVar2 - 6;
      EncodeBase64::anon_class_8_1_ba1d7991::operator()
                (&local_40,(uint)(uVar1 >> ((byte)uVar2 & 0x3f)) & 0x3f);
    }
  }
  if (uVar2 != 0) {
    EncodeBase64::anon_class_8_1_ba1d7991::operator()
              (&local_40,(uint)uVar1 << (6U - (char)uVar2 & 0x1f) & 0x3f);
  }
  while ((__return_storage_ptr__->_M_string_length & 3) != 0) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
              (__return_storage_ptr__,'=');
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

std::string EncodeBase64(Span<const unsigned char> input)
{
    static const char *pbase64 = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/";

    std::string str;
    str.reserve(((input.size() + 2) / 3) * 4);
    ConvertBits<8, 6, true>([&](int v) { str += pbase64[v]; }, input.begin(), input.end());
    while (str.size() % 4) str += '=';
    return str;
}